

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

int mbedtls_pem_write_buffer
              (char *header,char *footer,uchar *der_data,size_t der_len,uchar *buf,size_t buf_len,
              size_t *olen)

{
  size_t sVar1;
  uchar *__src;
  char *__src_00;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  undefined1 *puVar5;
  size_t local_98;
  size_t add_len;
  size_t use_len;
  size_t len;
  uchar *p;
  uchar *c;
  uchar *encode_buf;
  size_t sStack_40;
  int ret;
  size_t buf_len_local;
  uchar *buf_local;
  size_t der_len_local;
  uchar *der_data_local;
  char *footer_local;
  char *header_local;
  
  use_len = 0;
  len = (size_t)buf;
  sStack_40 = buf_len;
  buf_len_local = (size_t)buf;
  buf_local = (uchar *)der_len;
  der_len_local = (size_t)der_data;
  der_data_local = (uchar *)footer;
  footer_local = header;
  mbedtls_base64_encode((uchar *)0x0,0,&add_len,der_data,der_len);
  sVar2 = strlen(footer_local);
  sVar3 = strlen((char *)der_data_local);
  lVar4 = sVar2 + sVar3 + (add_len >> 6) + 1;
  if (sStack_40 < add_len + lVar4) {
    *olen = add_len + lVar4;
    header_local._4_4_ = -0x2a;
  }
  else {
    c = (uchar *)calloc(1,add_len);
    if (c == (uchar *)0x0) {
      header_local._4_4_ = -0x1180;
    }
    else {
      encode_buf._4_4_ =
           mbedtls_base64_encode(c,add_len,&add_len,(uchar *)der_len_local,(size_t)buf_local);
      __src_00 = footer_local;
      sVar1 = len;
      if (encode_buf._4_4_ == 0) {
        sVar2 = strlen(footer_local);
        memcpy((void *)sVar1,__src_00,sVar2);
        sVar2 = strlen(footer_local);
        len = sVar2 + len;
        p = c;
        while (__src = der_data_local, sVar1 = len, add_len != 0) {
          if (add_len < 0x41) {
            local_98 = add_len;
          }
          else {
            local_98 = 0x40;
          }
          use_len = local_98;
          memcpy((void *)len,p,local_98);
          add_len = add_len - use_len;
          puVar5 = (undefined1 *)(use_len + len);
          p = p + use_len;
          len = (size_t)(puVar5 + 1);
          *puVar5 = 10;
        }
        sVar2 = strlen((char *)der_data_local);
        memcpy((void *)sVar1,__src,sVar2);
        sVar2 = strlen((char *)der_data_local);
        puVar5 = (undefined1 *)(sVar2 + len);
        len = (size_t)(puVar5 + 1);
        *puVar5 = 0;
        *olen = len - buf_len_local;
        free(c);
        header_local._4_4_ = 0;
      }
      else {
        free(c);
        header_local._4_4_ = encode_buf._4_4_;
      }
    }
  }
  return header_local._4_4_;
}

Assistant:

int mbedtls_pem_write_buffer( const char *header, const char *footer,
                      const unsigned char *der_data, size_t der_len,
                      unsigned char *buf, size_t buf_len, size_t *olen )
{
    int ret;
    unsigned char *encode_buf, *c, *p = buf;
    size_t len = 0, use_len, add_len = 0;

    mbedtls_base64_encode( NULL, 0, &use_len, der_data, der_len );
    add_len = strlen( header ) + strlen( footer ) + ( use_len / 64 ) + 1;

    if( use_len + add_len > buf_len )
    {
        *olen = use_len + add_len;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    if( ( encode_buf = mbedtls_calloc( 1, use_len ) ) == NULL )
        return( MBEDTLS_ERR_PEM_ALLOC_FAILED );

    if( ( ret = mbedtls_base64_encode( encode_buf, use_len, &use_len, der_data,
                               der_len ) ) != 0 )
    {
        mbedtls_free( encode_buf );
        return( ret );
    }

    memcpy( p, header, strlen( header ) );
    p += strlen( header );
    c = encode_buf;

    while( use_len )
    {
        len = ( use_len > 64 ) ? 64 : use_len;
        memcpy( p, c, len );
        use_len -= len;
        p += len;
        c += len;
        *p++ = '\n';
    }

    memcpy( p, footer, strlen( footer ) );
    p += strlen( footer );

    *p++ = '\0';
    *olen = p - buf;

    mbedtls_free( encode_buf );
    return( 0 );
}